

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O0

int quicly_sendstate_acked
              (quicly_sendstate_t *state,quicly_sendstate_sent_t *args,size_t *bytes_to_shift)

{
  long *in_RDX;
  quicly_ranges_t *in_RSI;
  quicly_sendstate_t *in_RDI;
  uint64_t sent_upto;
  int ret;
  uint64_t prev_sent_upto;
  ulong local_38;
  uint64_t end;
  int local_4;
  
  end = ((in_RDI->acked).ranges)->end;
  local_4 = quicly_ranges_add(in_RSI,(uint64_t)in_RDX,end);
  if ((local_4 == 0) &&
     (local_4 = quicly_ranges_subtract(in_RSI,(uint64_t)in_RDX,end), local_4 == 0)) {
    if (((in_RDI->pending).num_ranges != 0) &&
       (((in_RDI->pending).ranges)->start < ((in_RDI->acked).ranges)->end)) {
      __assert_fail("state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                    ,0x82,
                    "int quicly_sendstate_acked(quicly_sendstate_t *, quicly_sendstate_sent_t *, size_t *)"
                   );
    }
    if (end == ((in_RDI->acked).ranges)->end) {
      *in_RDX = 0;
    }
    else {
      local_38 = ((in_RDI->acked).ranges)->end;
      if (in_RDI->final_size < local_38) {
        if (local_38 != in_RDI->final_size + 1) {
          __assert_fail("sent_upto == state->final_size + 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                        ,0x89,
                        "int quicly_sendstate_acked(quicly_sendstate_t *, quicly_sendstate_sent_t *, size_t *)"
                       );
        }
        local_38 = local_38 - 1;
      }
      *in_RDX = local_38 - end;
    }
    local_4 = check_amount_of_state(in_RDI);
  }
  return local_4;
}

Assistant:

int quicly_sendstate_acked(quicly_sendstate_t *state, quicly_sendstate_sent_t *args, size_t *bytes_to_shift)
{
    uint64_t prev_sent_upto = state->acked.ranges[0].end;
    int ret;

    /* adjust acked and pending ranges */
    if ((ret = quicly_ranges_add(&state->acked, args->start, args->end)) != 0)
        return ret;
    if ((ret = quicly_ranges_subtract(&state->pending, args->start, args->end)) != 0)
        return ret;
    assert(state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start);

    /* calculate number of bytes that can be retired from the send buffer */
    if (prev_sent_upto != state->acked.ranges[0].end) {
        uint64_t sent_upto = state->acked.ranges[0].end;
        if (sent_upto > state->final_size) {
            /* adjust EOS position */
            assert(sent_upto == state->final_size + 1);
            --sent_upto;
        }
        *bytes_to_shift = sent_upto - prev_sent_upto;
    } else {
        *bytes_to_shift = 0;
    }

    return check_amount_of_state(state);
}